

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

string * __thiscall
TrodesConfig::getPrintStr_abi_cxx11_(string *__return_storage_ptr__,TrodesConfig *this,int indent)

{
  pointer pNVar1;
  pointer pNVar2;
  ostream *poVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  string indentStr;
  ostringstream oss;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  string local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\t","");
  if (0 < indent) {
    iVar6 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Printing \'TrodesConfig\'\n",0x18);
  if (0 < indent) {
    iVar6 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -devices vector size[",0x19);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]:\n",3);
  if (0 < (int)((ulong)((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
    uVar7 = 0;
    do {
      iVar6 = indent;
      if (0 < indent) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        - i[",0xc);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)uVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] : \n",5);
      pNVar1 = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar1 >> 3) * -0x71c71c71c71c71c7;
      if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
        goto LAB_0020a215;
      }
      NDevice::getPrintStr_abi_cxx11_(&local_1d0,pNVar1 + uVar7,indent + 2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 <
             (long)((int)((ulong)((long)(this->devices).
                                        super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->devices).
                                       super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl
                                       .super__Vector_impl_data._M_start) >> 3) * 0x38e38e39));
  }
  if (0 < indent) {
    iVar6 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -nTrodes vector size[",0x19);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]:\n",3);
  if (0 < (int)((ulong)((long)(this->nTrodes).
                              super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->nTrodes).
                             super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
    uVar7 = 0;
    do {
      iVar6 = indent;
      if (0 < indent) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        - i[",0xc);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)uVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] : \n",5);
      pNVar2 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 3) *
              -0x71c71c71c71c71c7;
      if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
LAB_0020a215:
        uVar4 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar7);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar4);
      }
      NTrodeObj::getPrintStr_abi_cxx11_(&local_1d0,pNVar2 + uVar7,indent + 2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 <
             (long)((int)((ulong)((long)(this->nTrodes).
                                        super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->nTrodes).
                                       super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39)
            );
  }
  std::__cxx11::stringbuf::str();
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b0;
}

Assistant:

std::string TrodesConfig::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "\t";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "Printing 'TrodesConfig'\n";

    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -devices vector size[" << devices.size() << "]:\n";

    for (int i = 0; i < (int)devices.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : \n" << devices.at(i).getPrintStr(indent+2) << "\n";
    }

    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -nTrodes vector size[" << nTrodes.size() << "]:\n";

    for (int i = 0; i < (int)nTrodes.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : \n" << nTrodes.at(i).getPrintStr(indent+2) << "\n";
    }
    return(oss.str());
}